

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintSExpression::printDebugLocation
          (PrintSExpression *this,optional<wasm::Function::DebugLocation> *location)

{
  Module *pMVar1;
  __optional_eq_t<wasm::Function::DebugLocation,_wasm::Function::DebugLocation> _Var2;
  bool bVar3;
  DebugLocation *pDVar4;
  reference pvVar5;
  ostream *poVar6;
  uint *puVar7;
  string local_68 [8];
  value_type symbolName;
  string local_38 [8];
  value_type fileName;
  optional<wasm::Function::DebugLocation> *location_local;
  PrintSExpression *this_local;
  
  if (((this->minify & 1U) == 0) &&
     (((fileName.field_2._8_8_ = location,
       _Var2 = std::operator==(&this->lastPrintedLocation,location), !_Var2 ||
       (this->indent <= this->lastPrintIndent)) || ((this->full & 1U) != 0)))) {
    *(undefined8 *)
     &(this->lastPrintedLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload =
         *(undefined8 *)fileName.field_2._8_8_;
    *(undefined8 *)
     ((long)&(this->lastPrintedLocation).
             super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload + 8) =
         *(undefined8 *)(fileName.field_2._8_8_ + 8);
    *(undefined8 *)
     ((long)&(this->lastPrintedLocation).
             super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value.
             symbolNameIndex.super__Optional_base<unsigned_int,_true,_true> + 4) =
         *(undefined8 *)(fileName.field_2._8_8_ + 0x10);
    this->lastPrintIndent = this->indent;
    bVar3 = std::optional::operator_cast_to_bool((optional *)fileName.field_2._8_8_);
    if (bVar3) {
      pMVar1 = this->currModule;
      pDVar4 = std::optional<wasm::Function::DebugLocation>::operator->
                         ((optional<wasm::Function::DebugLocation> *)fileName.field_2._8_8_);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&pMVar1->debugInfoFileNames,(ulong)pDVar4->fileIndex);
      std::__cxx11::string::string(local_38,(string *)pvVar5);
      poVar6 = std::operator<<(this->o,";;@ ");
      poVar6 = std::operator<<(poVar6,local_38);
      poVar6 = std::operator<<(poVar6,":");
      pDVar4 = std::optional<wasm::Function::DebugLocation>::operator->
                         ((optional<wasm::Function::DebugLocation> *)fileName.field_2._8_8_);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,pDVar4->lineNumber);
      poVar6 = std::operator<<(poVar6,":");
      pDVar4 = std::optional<wasm::Function::DebugLocation>::operator->
                         ((optional<wasm::Function::DebugLocation> *)fileName.field_2._8_8_);
      std::ostream::operator<<(poVar6,pDVar4->columnNumber);
      pDVar4 = std::optional<wasm::Function::DebugLocation>::operator->
                         ((optional<wasm::Function::DebugLocation> *)fileName.field_2._8_8_);
      bVar3 = std::optional::operator_cast_to_bool((optional *)&pDVar4->symbolNameIndex);
      if (bVar3) {
        pMVar1 = this->currModule;
        pDVar4 = std::optional<wasm::Function::DebugLocation>::operator->
                           ((optional<wasm::Function::DebugLocation> *)fileName.field_2._8_8_);
        puVar7 = std::optional<unsigned_int>::operator*(&pDVar4->symbolNameIndex);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&pMVar1->debugInfoSymbolNames,(ulong)*puVar7);
        std::__cxx11::string::string(local_68,(string *)pvVar5);
        poVar6 = std::operator<<(this->o,":");
        std::operator<<(poVar6,local_68);
        std::__cxx11::string::~string(local_68);
      }
      std::operator<<(this->o,'\n');
      std::__cxx11::string::~string(local_38);
    }
    else {
      std::operator<<(this->o,";;@\n");
    }
    doIndent(this->o,this->indent);
  }
  return;
}

Assistant:

void PrintSExpression::printDebugLocation(
  const std::optional<Function::DebugLocation>& location) {
  if (minify) {
    return;
  }
  // Do not skip repeated debug info in full mode, for less-confusing debugging:
  // full mode prints out everything in the most verbose manner.
  if (lastPrintedLocation == location && indent > lastPrintIndent && !full) {
    return;
  }
  lastPrintedLocation = location;
  lastPrintIndent = indent;
  if (!location) {
    o << ";;@\n";
  } else {
    auto fileName = currModule->debugInfoFileNames[location->fileIndex];
    o << ";;@ " << fileName << ":" << location->lineNumber << ":"
      << location->columnNumber;

    if (location->symbolNameIndex) {
      auto symbolName =
        currModule->debugInfoSymbolNames[*(location->symbolNameIndex)];
      o << ":" << symbolName;
    }

    o << '\n';
  }
  doIndent(o, indent);
}